

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

int R_FindSkin(char *name,int pclass)

{
  FPlayerSkin *pFVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int skin;
  ulong uVar5;
  
  iVar4 = strcasecmp("base",name);
  sVar2 = numskins;
  pFVar1 = skins;
  if ((iVar4 != 0) && (PlayerClasses.Count < numskins)) {
    uVar5 = (ulong)PlayerClasses.Count;
    do {
      iVar4 = strncasecmp(pFVar1[uVar5].name,name,0x10);
      skin = (int)uVar5;
      if (iVar4 == 0) {
        bVar3 = FPlayerClass::CheckSkin(PlayerClasses.Array + pclass,skin);
        if (!bVar3) {
          return pclass;
        }
        return skin;
      }
      uVar5 = (ulong)(skin + 1);
    } while (uVar5 < sVar2);
  }
  return pclass;
}

Assistant:

int R_FindSkin (const char *name, int pclass)
{
	if (stricmp ("base", name) == 0)
	{
		return pclass;
	}

	for (unsigned i = PlayerClasses.Size(); i < numskins; i++)
	{
		if (strnicmp (skins[i].name, name, 16) == 0)
		{
			if (PlayerClasses[pclass].CheckSkin (i))
				return i;
			else
				return pclass;
		}
	}
	return pclass;
}